

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

sat_solver * Pdr_ManCreateSolver(Pdr_Man_t *p,int k)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Vec_t *pVVar4;
  sat_solver *psVar5;
  void **ppvVar6;
  void *pvVar7;
  Aig_Man_t *pAVar8;
  int iVar9;
  long lVar10;
  
  if (p->vSolvers->nSize != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                  ,0x32,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  if (p->vClauses->nSize == k) {
    if (p->vActVars->nSize != k) {
      __assert_fail("Vec_IntSize(p->vActVars) == k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                    ,0x34,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
    }
    psVar5 = zsat_solver_new_seed((double)p->pPars->nRandomSeed);
    psVar5 = Pdr_ManNewSolver(psVar5,p,k,(uint)(k == 0));
    pVVar3 = p->vSolvers;
    uVar2 = pVVar3->nSize;
    if (uVar2 == pVVar3->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar6;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
        }
        pVVar3->pArray = ppvVar6;
        pVVar3->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar6 = pVVar3->pArray;
    }
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    ppvVar6[iVar9] = psVar5;
    pVVar4 = p->vClauses;
    iVar9 = pVVar4->nSize;
    if (iVar9 <= k) {
      iVar1 = k + 1;
      if (pVVar4->nCap <= k) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((long)iVar1 << 3);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar4->pArray,(long)iVar1 << 3);
          iVar9 = pVVar4->nSize;
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = iVar1;
      }
      if (iVar9 <= k) {
        lVar10 = (long)iVar9;
        iVar9 = (k - iVar9) + 1;
        do {
          pvVar7 = calloc(1,0x10);
          pVVar4->pArray[lVar10] = pvVar7;
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      pVVar4->nSize = iVar1;
    }
    Vec_IntPush(p->vActVars,0);
    pAVar8 = p->pAig;
    if (0 < pAVar8->nTruePos) {
      lVar10 = 0;
      do {
        if (pAVar8->vCos->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Pdr_ObjSatVar(p,k,1,(Aig_Obj_t *)pAVar8->vCos->pArray[lVar10]);
        lVar10 = lVar10 + 1;
        pAVar8 = p->pAig;
      } while (lVar10 < pAVar8->nTruePos);
    }
    return psVar5;
  }
  __assert_fail("Vec_VecSize(p->vClauses) == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                ,0x33,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new SAT solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Pdr_ManCreateSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_VecSize(p->vClauses) == k );
    assert( Vec_IntSize(p->vActVars) == k );
    // create new solver
//    pSat = sat_solver_new();
    pSat = zsat_solver_new_seed(p->pPars->nRandomSeed);
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_VecExpand( p->vClauses, k );
    Vec_IntPush( p->vActVars, 0 );
    // add property cone
    Saig_ManForEachPo( p->pAig, pObj, i )
        Pdr_ObjSatVar( p, k, 1, pObj );
    return pSat;
}